

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ures.h
# Opt level: O2

UnicodeString *
icu_63::ures_getUnicodeStringByIndex
          (UnicodeString *__return_storage_ptr__,UResourceBundle *resB,int32_t indexS,
          UErrorCode *status)

{
  int32_t len;
  ConstChar16Ptr local_28 [3];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003edbf0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  len = 0;
  local_28[0].p_ = ures_getStringByIndex_63(resB,indexS,&len,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::setTo(__return_storage_ptr__,'\x01',local_28,len);
  }
  else {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString
ures_getUnicodeStringByIndex(const UResourceBundle *resB, int32_t indexS, UErrorCode* status) {
    UnicodeString result;
    int32_t len = 0;
    const UChar* r = ures_getStringByIndex(resB, indexS, &len, status);
    if(U_SUCCESS(*status)) {
        result.setTo(TRUE, r, len);
    } else {
        result.setToBogus();
    }
    return result;
}